

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cliques.cpp
# Opt level: O1

void find_cliques(void)

{
  pointer piVar1;
  bool bVar2;
  __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  __first;
  __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  __last;
  uint uVar3;
  long lVar4;
  int *piVar5;
  ostream *poVar6;
  long *plVar7;
  ulong uVar8;
  mapped_type *pmVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  pointer piVar13;
  long lVar14;
  long lVar15;
  pair<int_*,_long> pVar16;
  set<int,_std::less<int>,_std::allocator<int>_> P;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>
  local_118;
  ulong local_100;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_f8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_98;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  freopen("cliques.txt","w",_stdout);
  local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8._M_impl.super__Rb_tree_header._M_header;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._M_original_len._0_4_ = 0;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < V) {
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_f8,(int *)&local_118);
      piVar13 = edge.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(int)local_118._M_original_len].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar1 = edge.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)local_118._M_original_len].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      if (piVar13 != piVar1) {
        lVar4 = (long)piVar1 - (long)piVar13 >> 2;
        pVar16 = std::get_temporary_buffer<int>((lVar4 - (lVar4 + 1 >> 0x3f)) + 1 >> 1);
        piVar5 = pVar16.first;
        if (piVar5 == (int *)0x0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar13,piVar1);
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar13,piVar1,piVar5,pVar16.second);
        }
        operator_delete(piVar5);
      }
      local_118._M_original_len._0_4_ = (int)local_118._M_original_len + 1;
    } while ((int)local_118._M_original_len < V);
  }
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl._0_8_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_60,&local_f8);
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl._0_8_ = 0;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  bron_kerbosch((set<int,_std::less<int>,_std::allocator<int>_> *)&local_98,
                (set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,
                (set<int,_std::less<int>,_std::allocator<int>_> *)&local_c8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_c8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_98);
  __last._M_current = DAT_00119228._M_current;
  __first._M_current = (anonymous_namespace)::cliques._M_current;
  if ((anonymous_namespace)::cliques._M_current != DAT_00119228._M_current) {
    lVar4 = ((long)DAT_00119228._M_current - (long)(anonymous_namespace)::cliques._M_current >> 3) *
            -0x5555555555555555;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>
    ::_Temporary_buffer(&local_118,(anonymous_namespace)::cliques,
                        (lVar4 - (lVar4 + 1 >> 0x3f)) + 1 >> 1);
    if (local_118._M_buffer == (vector<int,_std::allocator<int>_> *)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&)>>
                (__first,__last,
                 (_Iter_comp_iter<bool_(*)(const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&)>
                  )0x10a79e);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,std::vector<int,std::allocator<int>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&)>>
                (__first,__last,local_118._M_buffer,local_118._M_len,
                 (_Iter_comp_iter<bool_(*)(const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&)>
                  )0x10a79e);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>
    ::~_Temporary_buffer(&local_118);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Distribution:",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  uVar3 = (int)((ulong)((long)DAT_00119228._M_current -
                       (long)(anonymous_namespace)::cliques._M_current) >> 3) * -0x55555555 - 1;
  if ((int)uVar3 < 0) {
    iVar11 = 0;
    iVar10 = 0;
  }
  else {
    lVar4 = (ulong)uVar3 * 0x18 + 8;
    iVar10 = 0;
    uVar12 = 0;
    lVar14 = (ulong)uVar3 + 1;
    do {
      if ((ulong)(long)(int)uVar12 <
          (ulong)(*(long *)((long)&(((anonymous_namespace)::cliques._M_current)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar4) -
                  *(long *)((long)(anonymous_namespace)::cliques._M_current + lVar4 + -8) >> 2)) {
        if (0 < iVar10) {
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
          plVar7 = (long *)std::ostream::operator<<(poVar6,iVar10);
          std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
          std::ostream::put((char)plVar7);
          std::ostream::flush();
        }
        uVar12 = (ulong)(*(long *)((long)&(((anonymous_namespace)::cliques._M_current)->
                                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                          super__Vector_impl_data._M_start + lVar4) -
                        *(long *)((long)(anonymous_namespace)::cliques._M_current + lVar4 + -8)) >>
                 2;
        iVar10 = 0;
      }
      iVar11 = (int)uVar12;
      iVar10 = iVar10 + 1;
      lVar4 = lVar4 + -0x18;
      lVar15 = lVar14 + -1;
      bVar2 = 0 < lVar14;
      lVar14 = lVar15;
    } while (lVar15 != 0 && bVar2);
  }
  if (0 < iVar10) {
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
    plVar7 = (long *)std::ostream::operator<<(poVar6,iVar10);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cliques:",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  uVar12 = 0;
  while (uVar8 = ((long)DAT_00119228._M_current - (long)(anonymous_namespace)::cliques._M_current >>
                 3) * -0x5555555555555555, uVar12 <= uVar8 && uVar8 - uVar12 != 0) {
    local_100 = uVar12 + 1;
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_100);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(",1);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"): ",3);
    piVar13 = (anonymous_namespace)::cliques._M_current[uVar12].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    if ((anonymous_namespace)::cliques._M_current[uVar12].
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
        piVar13) {
      lVar4 = 0;
      uVar8 = 0;
      do {
        pmVar9 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&name_abi_cxx11_,(key_type *)((long)piVar13 + lVar4));
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(pmVar9->_M_dataplus)._M_p,
                            pmVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,". ",2);
        uVar8 = uVar8 + 1;
        piVar13 = (anonymous_namespace)::cliques._M_current[uVar12].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        lVar4 = lVar4 + 4;
      } while (uVar8 < (ulong)((long)(anonymous_namespace)::cliques._M_current[uVar12].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar13 >> 2));
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    uVar12 = local_100;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_f8);
  return;
}

Assistant:

void find_cliques() {
    freopen("cliques.txt", "w", stdout); // output file

    set <int> P;
    for (int i = 0; i < V; i++) {
        P.insert(i);
        stable_sort(edge[i].begin(), edge[i].end());
    }
    
    bron_kerbosch(set<int>(), P, set<int>());

    stable_sort(cliques.begin(), cliques.end(), compare_vectors_by_size);

    cout << "Distribution:" << endl;
    int max_size = 0;
    int max_counter = 0;
    for (int i = cliques.size()-1; i >= 0 ; i--) {
        if (cliques[i].size() > max_size) {
            if (max_counter > 0) {
                cout << max_size << ": " << max_counter << endl;
            }
            max_size = cliques[i].size();
            max_counter = 0;
        }

        max_counter++;
    }
    if (max_counter > 0) {
        cout << max_size << ": " << max_counter << endl;
    }

    cout << "Cliques:" << endl;
    for (int i = 0; i < cliques.size(); i++) {
        cout << i + 1 << "(" << cliques[i].size() << "): ";
        for (int j = 0; j < cliques[i].size(); j++) {
            cout << name[cliques[i][j]] << ". ";
        }
        cout << endl;
    }
}